

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

void __thiscall
spvtools::val::ValidationState_t::RegisterExtension(ValidationState_t *this,Extension ext)

{
  bool bVar1;
  Extension local_3c;
  pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> local_38;
  
  local_3c = ext;
  bVar1 = EnumSet<spvtools::Extension>::contains(&this->module_extensions_,ext);
  if (!bVar1) {
    EnumSet<spvtools::Extension>::insert(&local_38,&this->module_extensions_,&local_3c);
    if (local_3c - kSPV_AMD_gpu_shader_half_float < 4) {
      *(undefined1 *)
       ((long)&this->context_ +
       *(long *)(&DAT_007e6358 + (ulong)(local_3c - kSPV_AMD_gpu_shader_half_float) * 8)) = 1;
    }
  }
  return;
}

Assistant:

void ValidationState_t::RegisterExtension(Extension ext) {
  if (module_extensions_.contains(ext)) return;

  module_extensions_.insert(ext);

  switch (ext) {
    case kSPV_AMD_gpu_shader_half_float:
    case kSPV_AMD_gpu_shader_half_float_fetch:
      // SPV_AMD_gpu_shader_half_float enables float16 type.
      // https://github.com/KhronosGroup/SPIRV-Tools/issues/1375
      features_.declare_float16_type = true;
      break;
    case kSPV_AMD_gpu_shader_int16:
      // This is not yet in the extension, but it's recommended for it.
      // See https://github.com/KhronosGroup/glslang/issues/848
      features_.uconvert_spec_constant_op = true;
      break;
    case kSPV_AMD_shader_ballot:
      // The grammar doesn't encode the fact that SPV_AMD_shader_ballot
      // enables the use of group operations Reduce, InclusiveScan,
      // and ExclusiveScan.  Enable it manually.
      // https://github.com/KhronosGroup/SPIRV-Tools/issues/991
      features_.group_ops_reduce_and_scans = true;
      break;
    default:
      break;
  }
}